

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 op_addr_rr_pre(DisasContext_conflict1 *s,arg_ldst_rr *a)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 arg2;
  TCGv_i32 var;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg2 = load_reg(s,a->rn);
  if (((s->v8m_stackcheck == true) && (a->rn == 0xd)) && (a->w != 0)) {
    gen_helper_v8m_stackcheck(tcg_ctx,tcg_ctx->cpu_env,arg2);
  }
  if (a->p != 0) {
    var = load_reg(s,a->rm);
    gen_arm_shift_im(tcg_ctx,var,a->shtype,a->shimm,0);
    if (a->u == 0) {
      tcg_gen_sub_i32(tcg_ctx,arg2,arg2,var);
    }
    else {
      tcg_gen_add_i32(tcg_ctx,arg2,arg2,var);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  }
  return arg2;
}

Assistant:

static TCGv_i32 op_addr_rr_pre(DisasContext *s, arg_ldst_rr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr = load_reg(s, a->rn);

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, addr);
    }

    if (a->p) {
        TCGv_i32 ofs = load_reg(s, a->rm);
        gen_arm_shift_im(tcg_ctx, ofs, a->shtype, a->shimm, 0);
        if (a->u) {
            tcg_gen_add_i32(tcg_ctx, addr, addr, ofs);
        } else {
            tcg_gen_sub_i32(tcg_ctx, addr, addr, ofs);
        }
        tcg_temp_free_i32(tcg_ctx, ofs);
    }
    return addr;
}